

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

shared_ptr<helics::Core> helics::CoreFactory::makeCore(CoreType type,string_view name)

{
  string_view message;
  undefined8 uVar1;
  element_type *peVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int in_ESI;
  shared_ptr<helics::Core> *in_RDI;
  shared_ptr<helics::Core> sVar4;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff98;
  shared_ptr<helics::Core> *psVar5;
  HelicsException *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd4;
  
  if (in_ESI == 0x42) {
    uVar1 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
               (char *)in_RDI);
    message._M_str = in_stack_ffffffffffffffc0;
    message._M_len = in_stack_ffffffffffffffb8;
    HelicsException::HelicsException(in_stack_ffffffffffffffb0,message);
    __cxa_throw(uVar1,&HelicsException::typeinfo,HelicsException::~HelicsException);
  }
  psVar5 = in_RDI;
  if (in_ESI == 0) {
    MasterCoreBuilder::getIndexedBuilder((size_t)in_stack_ffffffffffffffb0);
    peVar2 = std::
             __shared_ptr_access<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4e7adc);
    (**peVar2->_vptr_CoreBuilder)(in_RDI,peVar2,in_RDX,in_RCX);
    _Var3._M_pi = extraout_RDX;
  }
  else if (in_ESI == 0x4d) {
    std::shared_ptr<helics::Core>::shared_ptr(in_RDI,in_stack_ffffffffffffff98);
    _Var3._M_pi = extraout_RDX_00;
    psVar5 = in_RDI;
  }
  else {
    MasterCoreBuilder::getBuilder(in_stack_ffffffffffffffd4);
    peVar2 = std::
             __shared_ptr_access<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4e7b34);
    (**peVar2->_vptr_CoreBuilder)(in_RDI,peVar2,in_RDX,in_RCX);
    _Var3._M_pi = extraout_RDX_01;
  }
  sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)psVar5
  ;
  return (shared_ptr<helics::Core>)
         sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> makeCore(CoreType type, std::string_view name)
{
    if (type == CoreType::NULLCORE) {
        throw(HelicsException("nullcore is explicitly not available nor will ever be"));
    }
    if (type == CoreType::DEFAULT) {
        return MasterCoreBuilder::getIndexedBuilder(0)->build(name);
    }
    if (type == CoreType::EMPTY) {
        return emptyCore;
    }
    return MasterCoreBuilder::getBuilder(static_cast<int>(type))->build(name);
}